

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O0

bool fs_set_modtime(string_view path,bool quiet)

{
  string_view path_00;
  bool bVar1;
  string_view local_88;
  size_t local_78;
  char *local_70;
  duration local_68;
  path local_60;
  undefined1 local_38 [8];
  error_code ec;
  undefined1 auStack_20 [7];
  bool quiet_local;
  string_view path_local;
  
  path_local._M_len = (size_t)path._M_str;
  _auStack_20 = path._M_len;
  ec._M_cat._7_1_ = quiet;
  std::error_code::error_code((error_code *)local_38);
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_60,(basic_string_view<char,_std::char_traits<char>_> *)auStack_20,auto_format);
  local_68.__r = (rep)std::filesystem::__file_clock::now();
  std::filesystem::last_write_time(&local_60,local_68.__r,local_38);
  std::filesystem::__cxx11::path::~path(&local_60);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_38);
  if (bVar1) {
    if ((ec._M_cat._7_1_ & 1) == 0) {
      local_78 = _auStack_20;
      local_70 = (char *)path_local._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_88,"fs_set_modtime");
      path_00._M_str = local_70;
      path_00._M_len = local_78;
      fs_print_error(path_00,local_88,(error_code *)local_38);
    }
    path_local._M_str._7_1_ = false;
  }
  else {
    path_local._M_str._7_1_ = true;
  }
  return path_local._M_str._7_1_;
}

Assistant:

bool fs_set_modtime(std::string_view path, const bool quiet)
{

  std::error_code ec;

#ifdef HAVE_CXX_FILESYSTEM

  std::filesystem::last_write_time(path, std::filesystem::file_time_type::clock::now(), ec);
  if(!ec) FFS_LIKELY
    return true;
  // techinically IWYU <chrono> but that can break some compilers, and it works without the include.

#elif defined(_WIN32)
// https://learn.microsoft.com/en-us/windows/win32/SysInfo/changing-a-file-time-to-the-current-time
  HANDLE h = CreateFileA(path.data(),
                         FILE_WRITE_ATTRIBUTES, FILE_SHARE_WRITE, nullptr,
                         OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, nullptr);
  if (h){
    FILETIME t;
    // https://learn.microsoft.com/en-us/windows/win32/api/sysinfoapi/nf-sysinfoapi-getsystemtimeasfiletime
    GetSystemTimeAsFileTime(&t);
    BOOL ok = SetFileTime(h, nullptr, nullptr, &t);

    if(CloseHandle(h) && ok) FFS_LIKELY
      return true;
  }
#else
  // utimensat available in macOS since 10.13
  // https://github.com/python/cpython/issues/75782
  // https://gitlab.kitware.com/cmake/cmake/-/issues/17101
  if (utimensat(AT_FDCWD, path.data(), nullptr, 0) == 0)  FFS_LIKELY
    return true;
#endif

  if (!quiet)
    fs_print_error(path, __func__, ec);

  return false;
}